

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.h
# Opt level: O3

size_t Potassco::convert_seq<unsigned_int,unsigned_int*>
                 (char *x,size_t maxLen,uint *out,char sep,char **errPos)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  uint temp;
  char *local_50;
  uint local_44;
  ulong local_40;
  char **local_38;
  
  if (x == (char *)0x0) {
    sVar3 = 0;
  }
  else {
    cVar1 = *x;
    local_50 = x;
    if (cVar1 == '[') {
      local_50 = x + 1;
    }
    local_40 = (ulong)(cVar1 == '[');
    if (maxLen == 0) {
      sVar3 = 0;
    }
    else {
      sVar4 = 0;
      local_38 = errPos;
      while (iVar2 = xconvert(local_50,&local_44,&local_50,(int)sep), sVar3 = sVar4,
            errPos = local_38, iVar2 != 0) {
        out[sVar4] = local_44;
        sVar4 = sVar4 + 1;
        sVar3 = sVar4;
        if ((((*local_50 == '\0') || (*local_50 != sep)) || (local_50[1] == '\0')) ||
           (local_50 = local_50 + 1, sVar3 = maxLen, maxLen == sVar4)) break;
      }
    }
    if ((cVar1 != '[') || (*local_50 == ']')) {
      x = local_50 + local_40;
    }
    if (errPos != (char **)0x0) {
      *errPos = x;
    }
  }
  return sVar3;
}

Assistant:

std::size_t convert_seq(const char* x, std::size_t maxLen, OutIt out, char sep, const char** errPos = 0) {
	if (!x) { return 0; }
	const char* n = x;
	std::size_t t = 0;
	std::size_t b = 0;
	if (*n == '[') { ++b; ++n; }
	while (t != maxLen) {
		T temp;
		if (!xconvert(n, temp, &n, sep)) break;
		*out++ = temp;
		++t;
		if (!*n || *n != (char)sep || !n[1]) break;
		n = n+1;
	}
	if (!b || *n == ']') { n += b; }
	else                 { n  = x; }
	if (errPos) *errPos = n;
	return t;
}